

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dac.c
# Opt level: O3

void * dac_new(t_symbol *s,int argc,t_atom *argv)

{
  t_object *owner;
  _gobj *p_Var1;
  ulong uVar2;
  int iVar3;
  t_float tVar4;
  t_atom defarg [2];
  t_atom local_48;
  undefined4 local_38;
  undefined4 local_30;
  
  owner = (t_object *)pd_new(dac_class);
  if (argc == 0) {
    local_48.a_type = A_FLOAT;
    local_48.a_w.w_index = 0x3f800000;
    local_38 = 1;
    local_30 = 0x40000000;
    argc = 2;
    argv = &local_48;
  }
  owner[1].te_g.g_pd = (t_pd)(long)argc;
  p_Var1 = (_gobj *)getbytes((long)argc << 3);
  owner[1].te_g.g_next = p_Var1;
  if (0 < argc) {
    uVar2 = 0;
    do {
      tVar4 = atom_getfloatarg((int)uVar2,argc,argv);
      (&(owner[1].te_g.g_next)->g_pd)[uVar2] = (t_pd)(long)tVar4;
      uVar2 = uVar2 + 1;
    } while ((uint)argc != uVar2);
    if (argc != 1) {
      iVar3 = argc - 1;
      do {
        inlet_new(owner,(t_pd *)owner,&s_signal,&s_signal);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
  }
  *(undefined4 *)&owner[1].te_binbuf = 0;
  return owner;
}

Assistant:

static void *dac_new(t_symbol *s, int argc, t_atom *argv)
{
    t_dac *x = (t_dac *)pd_new(dac_class);
    t_atom defarg[2];
    int i;
    if (!argc)
    {
        argv = defarg;
        argc = 2;
        SETFLOAT(&defarg[0], 1);
        SETFLOAT(&defarg[1], 2);
    }
    x->x_n = argc;
    x->x_vec = (t_int *)getbytes(argc * sizeof(*x->x_vec));
    for (i = 0; i < argc; i++)
        x->x_vec[i] = atom_getfloatarg(i, argc, argv);
    for (i = 1; i < argc; i++)
        inlet_new(&x->x_obj, &x->x_obj.ob_pd, &s_signal, &s_signal);
    x->x_f = 0;
    return (x);
}